

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O0

int google::protobuf::compiler::cpp::anon_unknown_3::FixedSize(Type type)

{
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  Type local_10;
  int local_c;
  Type type_local;
  
  switch(type) {
  case TYPE_DOUBLE:
    local_c = 8;
    break;
  case TYPE_FLOAT:
    local_c = 4;
    break;
  case TYPE_INT64:
    local_c = -1;
    break;
  case TYPE_UINT64:
    local_c = -1;
    break;
  case TYPE_INT32:
    local_c = -1;
    break;
  case TYPE_FIXED64:
    local_c = 8;
    break;
  case TYPE_FIXED32:
    local_c = 4;
    break;
  case TYPE_BOOL:
    local_c = 1;
    break;
  case TYPE_STRING:
    local_c = -1;
    break;
  case TYPE_GROUP:
    local_c = -1;
    break;
  case TYPE_MESSAGE:
    local_c = -1;
    break;
  case TYPE_BYTES:
    local_c = -1;
    break;
  case TYPE_UINT32:
    local_c = -1;
    break;
  case TYPE_ENUM:
    local_c = -1;
    break;
  case TYPE_SFIXED32:
    local_c = 4;
    break;
  case TYPE_SFIXED64:
    local_c = 8;
    break;
  case TYPE_SINT32:
    local_c = -1;
    break;
  case MAX_TYPE:
    local_c = -1;
    break;
  default:
    local_10 = type;
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_primitive_field.cc"
               ,0x4e);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(local_55,other);
    internal::LogMessage::~LogMessage(&local_48);
    local_c = -1;
  }
  return local_c;
}

Assistant:

int FixedSize(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_INT32   : return -1;
    case FieldDescriptor::TYPE_INT64   : return -1;
    case FieldDescriptor::TYPE_UINT32  : return -1;
    case FieldDescriptor::TYPE_UINT64  : return -1;
    case FieldDescriptor::TYPE_SINT32  : return -1;
    case FieldDescriptor::TYPE_SINT64  : return -1;
    case FieldDescriptor::TYPE_FIXED32 : return WireFormatLite::kFixed32Size;
    case FieldDescriptor::TYPE_FIXED64 : return WireFormatLite::kFixed64Size;
    case FieldDescriptor::TYPE_SFIXED32: return WireFormatLite::kSFixed32Size;
    case FieldDescriptor::TYPE_SFIXED64: return WireFormatLite::kSFixed64Size;
    case FieldDescriptor::TYPE_FLOAT   : return WireFormatLite::kFloatSize;
    case FieldDescriptor::TYPE_DOUBLE  : return WireFormatLite::kDoubleSize;

    case FieldDescriptor::TYPE_BOOL    : return WireFormatLite::kBoolSize;
    case FieldDescriptor::TYPE_ENUM    : return -1;

    case FieldDescriptor::TYPE_STRING  : return -1;
    case FieldDescriptor::TYPE_BYTES   : return -1;
    case FieldDescriptor::TYPE_GROUP   : return -1;
    case FieldDescriptor::TYPE_MESSAGE : return -1;

    // No default because we want the compiler to complain if any new
    // types are added.
  }
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return -1;
}